

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.h
# Opt level: O0

void __thiscall mkvmuxer::Colour::Colour(Colour *this)

{
  Colour *this_local;
  
  this->matrix_coefficients_ = 0xffffffffffffffff;
  this->bits_per_channel_ = 0xffffffffffffffff;
  this->chroma_subsampling_horz_ = 0xffffffffffffffff;
  this->chroma_subsampling_vert_ = 0xffffffffffffffff;
  this->cb_subsampling_horz_ = 0xffffffffffffffff;
  this->cb_subsampling_vert_ = 0xffffffffffffffff;
  this->chroma_siting_horz_ = 0xffffffffffffffff;
  this->chroma_siting_vert_ = 0xffffffffffffffff;
  this->range_ = 0xffffffffffffffff;
  this->transfer_characteristics_ = 0xffffffffffffffff;
  this->primaries_ = 0xffffffffffffffff;
  this->max_cll_ = 0xffffffffffffffff;
  this->max_fall_ = 0xffffffffffffffff;
  this->mastering_metadata_ = (MasteringMetadata *)0x0;
  return;
}

Assistant:

Colour()
      : matrix_coefficients_(kValueNotPresent),
        bits_per_channel_(kValueNotPresent),
        chroma_subsampling_horz_(kValueNotPresent),
        chroma_subsampling_vert_(kValueNotPresent),
        cb_subsampling_horz_(kValueNotPresent),
        cb_subsampling_vert_(kValueNotPresent),
        chroma_siting_horz_(kValueNotPresent),
        chroma_siting_vert_(kValueNotPresent),
        range_(kValueNotPresent),
        transfer_characteristics_(kValueNotPresent),
        primaries_(kValueNotPresent),
        max_cll_(kValueNotPresent),
        max_fall_(kValueNotPresent),
        mastering_metadata_(NULL) {}